

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator::GenerateMembers
          (ImmutableMessageOneofFieldLiteGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  FieldDescriptor *pFVar2;
  string_view end_varname;
  string_view end_varname_00;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 aVar3;
  Options *pOVar4;
  undefined1 in_R8B;
  undefined1 uVar5;
  string_view local_268;
  undefined1 local_258 [80];
  string_view local_208;
  undefined1 local_1f8 [80];
  string_view local_1a8;
  FieldDescriptor local_198;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_140;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  string_view local_128;
  string_view local_118;
  FieldDescriptor local_108;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string_view local_98;
  string_view local_88 [2];
  FieldDescriptor local_68;
  Printer *printer_local;
  ImmutableMessageOneofFieldLiteGenerator *this_local;
  
  local_68.field_20 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27)printer;
  printer_local = (Printer *)this;
  PrintExtraFieldInfo(&(this->super_ImmutableMessageFieldLiteGenerator).variables_,printer);
  aVar3 = local_68.field_20;
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldLiteGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldLiteGenerator).context_);
  Options::Options((Options *)&local_68,pOVar4);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,&local_68,(Options *)0x0,(bool)in_R8B);
  Options::~Options((Options *)&local_68);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_88,
             "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,
             &(this->super_ImmutableMessageFieldLiteGenerator).variables_,local_88[0]);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"}");
  pFVar2 = (this->super_ImmutableMessageFieldLiteGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_b0);
  end_varname_00._M_str = local_a8._M_str;
  end_varname_00._M_len = local_a8._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_98,end_varname_00,pFVar2,local_b0);
  aVar3 = local_68.field_20;
  uVar5 = SUB81(local_a8._M_str,0);
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldLiteGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldLiteGenerator).context_);
  Options::Options((Options *)&local_108,pOVar4);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,&local_108,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_108);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,
             "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n     return ($type$) $oneof_name$_;\n  }\n  return $type$.getDefaultInstance();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,
             &(this->super_ImmutableMessageFieldLiteGenerator).variables_,local_118);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"}");
  pFVar2 = (this->super_ImmutableMessageFieldLiteGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_140);
  end_varname._M_str = local_138._M_str;
  end_varname._M_len = local_138._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_128,end_varname,pFVar2,local_140);
  aVar3 = local_68.field_20;
  uVar5 = SUB81(local_138._M_str,0);
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldLiteGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldLiteGenerator).context_);
  Options::Options((Options *)&local_198,pOVar4);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,&local_198,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_198);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,
             "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\nprivate void set$capitalized_name$($type$ value) {\n  value.getClass();  // minimal bytecode null check\n  $oneof_name$_ = value;\n  $set_oneof_case_message$;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,
             &(this->super_ImmutableMessageFieldLiteGenerator).variables_,local_1a8);
  aVar3 = local_68.field_20;
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldLiteGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldLiteGenerator).context_);
  Options::Options((Options *)local_1f8,pOVar4);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,(FieldDescriptor *)local_1f8,(Options *)0x0,
             (bool)uVar5);
  Options::~Options((Options *)local_1f8);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_208,
             "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\nprivate void merge$capitalized_name$($type$ value) {\n  value.getClass();  // minimal bytecode null check\n  if ($has_oneof_case_message$ &&\n      $oneof_name$_ != $type$.getDefaultInstance()) {\n    $oneof_name$_ = $type$.newBuilder(($type$) $oneof_name$_)\n        .mergeFrom(value).buildPartial();\n  } else {\n    $oneof_name$_ = value;\n  }\n  $set_oneof_case_message$;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,
             &(this->super_ImmutableMessageFieldLiteGenerator).variables_,local_208);
  aVar3 = local_68.field_20;
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldLiteGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldLiteGenerator).context_);
  Options::Options((Options *)local_258,pOVar4);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,(FieldDescriptor *)local_258,(Options *)0x0,
             (bool)uVar5);
  Options::~Options((Options *)local_258);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_268,
             "private void clear$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n  }\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,
             &(this->super_ImmutableMessageFieldLiteGenerator).variables_,local_268);
  return;
}

Assistant:

void ImmutableMessageOneofFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "     return ($type$) $oneof_name$_;\n"
                 "  }\n"
                 "  return $type$.getDefaultInstance();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\n"
                 "private void set$capitalized_name$($type$ value) {\n"
                 "  value.getClass();  // minimal bytecode null check\n"
                 "  $oneof_name$_ = value;\n"
                 "  $set_oneof_case_message$;\n"
                 "}\n");

  // Field.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\n"
      "private void merge$capitalized_name$($type$ value) {\n"
      "  value.getClass();  // minimal bytecode null check\n"
      "  if ($has_oneof_case_message$ &&\n"
      "      $oneof_name$_ != $type$.getDefaultInstance()) {\n"
      "    $oneof_name$_ = $type$.newBuilder(($type$) $oneof_name$_)\n"
      "        .mergeFrom(value).buildPartial();\n"
      "  } else {\n"
      "    $oneof_name$_ = value;\n"
      "  }\n"
      "  $set_oneof_case_message$;\n"
      "}\n");

  // Field.Builder clearField()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    $clear_oneof_case_message$;\n"
                 "    $oneof_name$_ = null;\n"
                 "  }\n"
                 "}\n");
}